

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_type(lua_State *L)

{
  int iVar1;
  char *s;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == 3) {
    iVar1 = lua_isinteger(L,1);
    s = "integer";
    if (iVar1 == 0) {
      s = "float";
    }
    lua_pushstring(L,s);
  }
  else {
    luaL_checkany(L,1);
    lua_pushnil(L);
  }
  return 1;
}

Assistant:

static int math_type (lua_State *L) {
  if (lua_type(L, 1) == LUA_TNUMBER)
    lua_pushstring(L, (lua_isinteger(L, 1)) ? "integer" : "float");
  else {
    luaL_checkany(L, 1);
    luaL_pushfail(L);
  }
  return 1;
}